

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O1

bool __thiscall crnlib::mipmapped_texture::unpack_from_dxt(mipmapped_texture *this,bool uncook)

{
  pixel_format pVar1;
  mip_level *pmVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if ((this->m_faces).m_size == 0) {
    return false;
  }
  pVar1 = this->m_format;
  if ((int)pVar1 < 0x41315844) {
    if ((int)pVar1 < 0x32495441) {
      if ((int)pVar1 < 0x31545844) {
        if ((pVar1 != PIXEL_FMT_ETC1) && (pVar1 != PIXEL_FMT_DXT5A)) {
          return false;
        }
      }
      else if ((pVar1 != PIXEL_FMT_DXT1) && (pVar1 != PIXEL_FMT_ETC2)) {
        return false;
      }
    }
    else if ((int)pVar1 < 0x33545844) {
      if ((pVar1 != PIXEL_FMT_3DC) && (pVar1 != PIXEL_FMT_DXT2)) {
        return false;
      }
    }
    else if (((pVar1 != PIXEL_FMT_DXT3) && (pVar1 != PIXEL_FMT_DXT4)) && (pVar1 != PIXEL_FMT_DXT5))
    {
      return false;
    }
  }
  else if ((int)pVar1 < 0x52784778) {
    if ((int)pVar1 < 0x52424741) {
      if ((pVar1 != PIXEL_FMT_DXT1A) && (pVar1 != PIXEL_FMT_ETC2A)) {
        return false;
      }
    }
    else if ((pVar1 != PIXEL_FMT_DXT5_AGBR) && (pVar1 != PIXEL_FMT_DXT5_xGBR)) {
      return false;
    }
  }
  else if ((int)pVar1 < 0x53413245) {
    if ((pVar1 != PIXEL_FMT_DXT5_xGxR) && (pVar1 != PIXEL_FMT_ETC1S)) {
      return false;
    }
  }
  else if (((pVar1 != PIXEL_FMT_ETC2AS) && (pVar1 != PIXEL_FMT_DXT5_CCxY)) &&
          (pVar1 != PIXEL_FMT_DXN)) {
    return false;
  }
  bVar8 = (this->m_faces).m_size != 0;
  if (bVar8) {
    uVar7 = 0;
    do {
      uVar3 = 0;
      do {
        uVar5 = uVar3;
        if ((this->m_faces).m_size == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (ulong)((this->m_faces).m_p)->m_size;
        }
        if (uVar6 <= uVar5) goto LAB_001322a3;
        bVar4 = mip_level::unpack_from_dxt((this->m_faces).m_p[uVar7].m_p[uVar5],false);
        uVar3 = uVar5 + 1;
      } while (bVar4);
      if (uVar5 < uVar6) {
        if (bVar8) {
          return false;
        }
        break;
      }
LAB_001322a3:
      uVar7 = uVar7 + 1;
      bVar8 = uVar7 < (this->m_faces).m_size;
    } while (bVar8);
  }
  pmVar2 = *((this->m_faces).m_p)->m_p;
  this->m_format = pmVar2->m_format;
  this->m_comp_flags = pmVar2->m_comp_flags;
  return true;
}

Assistant:

inline bool is_valid() const { return m_faces.size() > 0; }